

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O0

void golf_editor_edit_mode_geo_add_face(golf_geo_face_t face)

{
  golf_geo_face_t *old_ptr_start;
  golf_geo_t *pgVar1;
  int iVar2;
  char *old_ptr;
  int idx;
  int i;
  golf_geo_t *geo;
  
  pgVar1 = editor.edit_mode.geo;
  if (editor.in_edit_mode) {
    if ((int)face.idx.data < 3) {
      golf_log_warning("Invalid number of points face");
    }
    else {
      for (old_ptr._4_4_ = 0; old_ptr._4_4_ < (int)face.idx.data; old_ptr._4_4_ = old_ptr._4_4_ + 1)
      {
        iVar2 = *(int *)(face._64_8_ + (long)old_ptr._4_4_ * 4);
        if ((iVar2 < 0) || (((editor.edit_mode.geo)->points).length <= iVar2)) {
          golf_log_warning("Invalid point idx in face");
          return;
        }
      }
      old_ptr_start = ((editor.edit_mode.geo)->faces).data;
      iVar2 = vec_expand_((char **)&(editor.edit_mode.geo)->faces,
                          &((editor.edit_mode.geo)->faces).length,
                          &((editor.edit_mode.geo)->faces).capacity,0x90,
                          ((editor.edit_mode.geo)->faces).alloc_category);
      if (iVar2 == 0) {
        iVar2 = (pgVar1->faces).length;
        (pgVar1->faces).length = iVar2 + 1;
        memcpy((pgVar1->faces).data + iVar2,&stack0x00000008,0x90);
      }
      if ((pgVar1->faces).data != old_ptr_start) {
        _golf_editor_fix_actions
                  (&((pgVar1->faces).data)->active,&old_ptr_start->active,
                   &old_ptr_start[(pgVar1->faces).length + -1].active,(golf_editor_action_t *)0x0);
      }
    }
  }
  else {
    golf_log_warning("Editor not in edit mode");
  }
  return;
}

Assistant:

void golf_editor_edit_mode_geo_add_face(golf_geo_face_t face) {
    if (!editor.in_edit_mode) {
        golf_log_warning("Editor not in edit mode");
        return;
    }

    golf_geo_t *geo = editor.edit_mode.geo;
    if (face.idx.length < 3) {
        golf_log_warning("Invalid number of points face");
        return;
    }
    for (int i = 0; i < face.idx.length; i++) {
        int idx = face.idx.data[i];
        if (idx < 0 || idx >= geo->points.length) {
            golf_log_warning("Invalid point idx in face");
            return;
        }
    }
    _vec_push_and_fix_actions(&geo->faces, face, NULL);
}